

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_ssi_filter_module.c
# Opt level: O3

ngx_int_t ngx_http_ssi_if(ngx_http_request_t *r,ngx_http_ssi_ctx_t *ctx,ngx_str_t **params)

{
  ngx_log_t *pnVar1;
  byte *__s1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  byte *pbVar5;
  ngx_int_t nVar6;
  long lVar7;
  char *flags;
  ngx_str_t *pnVar8;
  byte *pbVar9;
  bool bVar10;
  undefined1 local_60 [8];
  ngx_str_t right;
  ngx_str_t left;
  
  bVar3 = ctx->field_0x1a0;
  if ((bVar3 & 3) != 0 && (ctx->command).len == 2) {
    pnVar1 = r->connection->log;
    if (3 < pnVar1->log_level) {
      ngx_log_error_core(4,pnVar1,0,"the \"if\" command inside the \"if\" command");
      return 1;
    }
    return 1;
  }
  if ((bVar3 & 0x40) != 0) {
    bVar3 = bVar3 & 0xdf;
    goto LAB_0015e330;
  }
  pnVar8 = *params;
  pnVar1 = r->connection->log;
  if ((pnVar1->log_level & 0x100) != 0) {
    ngx_log_error_core(8,pnVar1,0,"ssi if expr=\"%V\"",pnVar8);
  }
  __s1 = pnVar8->data;
  pbVar9 = __s1 + pnVar8->len;
  pbVar5 = __s1;
  if (0 < (long)pnVar8->len) {
    do {
      bVar3 = *pbVar5;
      if ((byte)(bVar3 + 0xbf) < 0x1a) {
        *pbVar5 = bVar3 | 0x20;
      }
      else if ((9 < (byte)(bVar3 - 0x30) && 0x19 < (byte)(bVar3 + 0x9f)) &&
              ((((0x3d < bVar3 - 0x22 ||
                 ((0x2000000000000025U >> ((ulong)(bVar3 - 0x22) & 0x3f) & 1) == 0)) &&
                (bVar3 != 0x7d)) && (bVar3 != 0x7b)))) break;
      pbVar5 = pbVar5 + 1;
    } while (pbVar5 < pbVar9);
  }
  right.data = pbVar5 + -(long)__s1;
  if (pbVar5 < pbVar9) {
    do {
      bVar10 = *pbVar5 != 0x20;
      if (bVar10) break;
      pbVar5 = pbVar5 + 1;
    } while (pbVar5 < pbVar9);
  }
  else {
    bVar10 = false;
  }
  pnVar1 = r->connection->log;
  flags = (char *)right.data;
  if ((pnVar1->log_level & 0x100) != 0) {
    flags = "left: \"%V\"";
    ngx_log_error_core(8,pnVar1,0,"left: \"%V\"",&right.data);
  }
  nVar6 = ngx_http_ssi_evaluate_string
                    (r,(ngx_http_ssi_ctx_t *)&right.data,(ngx_str_t *)0x0,(ngx_uint_t)flags);
  if (nVar6 != 0) {
    return nVar6;
  }
  pnVar1 = r->connection->log;
  if ((pnVar1->log_level & 0x100) != 0) {
    flags = "evaluated left: \"%V\"";
    ngx_log_error_core(8,pnVar1,0,"evaluated left: \"%V\"",&right.data);
  }
  if (pbVar5 == pbVar9) {
    bVar3 = ctx->field_0x1a0 | 0x60;
    if (right.data == (u_char *)0x0) {
      bVar3 = ctx->field_0x1a0 & 0xdc;
    }
    ctx->field_0x1a0 = (bVar3 & 0xfc) + 1;
    return 0;
  }
  if ((bVar10) && (*pbVar5 == 0x3d)) {
    bVar10 = true;
    lVar7 = 1;
  }
  else {
    if ((pbVar9 <= pbVar5 + 1) || ((*pbVar5 != 0x21 || (pbVar5[1] != 0x3d)))) goto LAB_0015e48f;
    lVar7 = 2;
    bVar10 = false;
  }
  for (right.len = (size_t)(pbVar5 + lVar7); (right.len < pbVar9 && (*(byte *)right.len == 0x20));
      right.len = right.len + 1) {
  }
  pbVar5 = pbVar9 + -1;
  if (right.len < pbVar5) {
    bVar3 = *(byte *)right.len;
    flags = (char *)(ulong)bVar3;
    if (bVar3 == 0x5c) {
      if (*(byte *)(right.len + 1) == 0x2f) {
        right.len = (size_t)(right.len + 1);
      }
      goto LAB_0015e4c9;
    }
    if (bVar3 != 0x2f) goto LAB_0015e4c9;
    if (*pbVar5 != 0x2f) {
LAB_0015e48f:
      pnVar1 = r->connection->log;
      if (3 < pnVar1->log_level) {
        ngx_log_error_core(4,pnVar1,0,"invalid expression in \"%V\"",pnVar8);
        return 1;
      }
      return 1;
    }
    right.len = right.len + 1;
    pnVar8 = (ngx_str_t *)0x2;
    flags = &DAT_00000001;
    bVar2 = true;
    pbVar9 = pbVar5;
  }
  else {
LAB_0015e4c9:
    bVar2 = false;
    pnVar8 = (ngx_str_t *)0x0;
  }
  local_60 = (undefined1  [8])(pbVar9 + -right.len);
  pnVar1 = r->connection->log;
  if ((pnVar1->log_level & 0x100) != 0) {
    flags = "right: \"%V\"";
    ngx_log_error_core(8,pnVar1,0,"right: \"%V\"",local_60);
  }
  nVar6 = ngx_http_ssi_evaluate_string(r,(ngx_http_ssi_ctx_t *)local_60,pnVar8,(ngx_uint_t)flags);
  if (nVar6 != 0) {
    return nVar6;
  }
  pnVar1 = r->connection->log;
  if ((pnVar1->log_level & 0x100) != 0) {
    ngx_log_error_core(8,pnVar1,0,"evaluated right: \"%V\"",local_60);
  }
  if (bVar2) {
    *(byte *)((long)(u_char **)local_60 + right.len) = 0;
    nVar6 = ngx_http_ssi_regex_match(r,(ngx_str_t *)local_60,(ngx_str_t *)&right.data);
    if (nVar6 == -5) {
LAB_0015e5c0:
      if (bVar10 != false) goto LAB_0015e5a1;
    }
    else {
      if (nVar6 != 0) {
        return nVar6;
      }
      if (bVar10 == false) goto LAB_0015e5a1;
    }
LAB_0015e5c6:
    bVar3 = ctx->field_0x1a0 | 0x60;
  }
  else {
    if ((undefined1  [8])right.data != local_60) goto LAB_0015e5c0;
    iVar4 = strncmp((char *)__s1,(char *)right.len,(size_t)right.data);
    if (bVar10 != (iVar4 != 0)) goto LAB_0015e5c6;
LAB_0015e5a1:
    bVar3 = ctx->field_0x1a0 & 0xdf;
  }
  bVar3 = (bVar3 & 0xfc) + 1;
LAB_0015e330:
  ctx->field_0x1a0 = bVar3;
  return 0;
}

Assistant:

static ngx_int_t
ngx_http_ssi_if(ngx_http_request_t *r, ngx_http_ssi_ctx_t *ctx,
    ngx_str_t **params)
{
    u_char       *p, *last;
    ngx_str_t    *expr, left, right;
    ngx_int_t     rc;
    ngx_uint_t    negative, noregex, flags;

    if (ctx->command.len == 2) {
        if (ctx->conditional) {
            ngx_log_error(NGX_LOG_ERR, r->connection->log, 0,
                          "the \"if\" command inside the \"if\" command");
            return NGX_HTTP_SSI_ERROR;
        }
    }

    if (ctx->output_chosen) {
        ctx->output = 0;
        return NGX_OK;
    }

    expr = params[NGX_HTTP_SSI_IF_EXPR];

    ngx_log_debug1(NGX_LOG_DEBUG_HTTP, r->connection->log, 0,
                   "ssi if expr=\"%V\"", expr);

    left.data = expr->data;
    last = expr->data + expr->len;

    for (p = left.data; p < last; p++) {
        if (*p >= 'A' && *p <= 'Z') {
            *p |= 0x20;
            continue;
        }

        if ((*p >= 'a' && *p <= 'z')
             || (*p >= '0' && *p <= '9')
             || *p == '$' || *p == '{' || *p == '}' || *p == '_'
             || *p == '"' || *p == '\'')
        {
            continue;
        }

        break;
    }

    left.len = p - left.data;

    while (p < last && *p == ' ') {
        p++;
    }

    flags = 0;

    ngx_log_debug1(NGX_LOG_DEBUG_HTTP, r->connection->log, 0,
                   "left: \"%V\"", &left);

    rc = ngx_http_ssi_evaluate_string(r, ctx, &left, flags);

    if (rc != NGX_OK) {
        return rc;
    }

    ngx_log_debug1(NGX_LOG_DEBUG_HTTP, r->connection->log, 0,
                   "evaluated left: \"%V\"", &left);

    if (p == last) {
        if (left.len) {
            ctx->output = 1;
            ctx->output_chosen = 1;

        } else {
            ctx->output = 0;
        }

        ctx->conditional = NGX_HTTP_SSI_COND_IF;

        return NGX_OK;
    }

    if (p < last && *p == '=') {
        negative = 0;
        p++;

    } else if (p + 1 < last && *p == '!' && *(p + 1) == '=') {
        negative = 1;
        p += 2;

    } else {
        goto invalid_expression;
    }

    while (p < last && *p == ' ') {
        p++;
    }

    if (p < last - 1 && *p == '/') {
        if (*(last - 1) != '/') {
            goto invalid_expression;
        }

        noregex = 0;
        flags = NGX_HTTP_SSI_ADD_ZERO;
        last--;
        p++;

    } else {
        noregex = 1;
        flags = 0;

        if (p < last - 1 && p[0] == '\\' && p[1] == '/') {
            p++;
        }
    }

    right.len = last - p;
    right.data = p;

    ngx_log_debug1(NGX_LOG_DEBUG_HTTP, r->connection->log, 0,
                   "right: \"%V\"", &right);

    rc = ngx_http_ssi_evaluate_string(r, ctx, &right, flags);

    if (rc != NGX_OK) {
        return rc;
    }

    ngx_log_debug1(NGX_LOG_DEBUG_HTTP, r->connection->log, 0,
                   "evaluated right: \"%V\"", &right);

    if (noregex) {
        if (left.len != right.len) {
            rc = -1;

        } else {
            rc = ngx_strncmp(left.data, right.data, right.len);
        }

    } else {
        right.data[right.len] = '\0';

        rc = ngx_http_ssi_regex_match(r, &right, &left);

        if (rc == NGX_OK) {
            rc = 0;
        } else if (rc == NGX_DECLINED) {
            rc = -1;
        } else {
            return rc;
        }
    }

    if ((rc == 0 && !negative) || (rc != 0 && negative)) {
        ctx->output = 1;
        ctx->output_chosen = 1;

    } else {
        ctx->output = 0;
    }

    ctx->conditional = NGX_HTTP_SSI_COND_IF;

    return NGX_OK;

invalid_expression:

    ngx_log_error(NGX_LOG_ERR, r->connection->log, 0,
                  "invalid expression in \"%V\"", expr);

    return NGX_HTTP_SSI_ERROR;
}